

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void basisu::vector<basisu::image>::object_mover(void *pDst_void,void *pSrc_void,uint32_t num)

{
  color_rgba *__ptr;
  image *pSrc;
  image *piVar1;
  
  if (num != 0) {
    piVar1 = (image *)((ulong)num * 0x20 + (long)pSrc_void);
    do {
      image::image((image *)pDst_void,(image *)pSrc_void);
      __ptr = (((image *)pSrc_void)->m_pixels).m_p;
      if (__ptr != (color_rgba *)0x0) {
        free(__ptr);
      }
      pSrc_void = (void *)((long)pSrc_void + 0x20);
      pDst_void = (void *)((long)pDst_void + 0x20);
    } while ((image *)pSrc_void != piVar1);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }